

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

JavascriptFunction *
Js::TypedArrayBase::GetDefaultConstructor(Var object,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  RuntimeFunction *pRVar5;
  Type TVar6;
  
  if (object == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00d6c0f8;
    *puVar4 = 0;
  }
  if (((ulong)object & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)object & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00d6c0f8;
    *puVar4 = 0;
  }
  TVar6 = TypeIds_FirstNumberType;
  if ((((ulong)object & 0xffff000000000000) != 0x1000000000000) &&
     (TVar6 = TypeIds_Number, (ulong)object >> 0x32 == 0)) {
    this = UnsafeVarTo<Js::RecyclableObject>(object);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00d6c0f8;
      *puVar4 = 0;
    }
    TVar6 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar6) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_00d6c0f8;
      *puVar4 = 0;
    }
  }
  switch(TVar6) {
  case TypeIds_Int8Array:
    pRVar5 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).Int8ArrayConstructor.ptr;
    break;
  case TypeIds_Uint8Array:
    pRVar5 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).Uint8ArrayConstructor.ptr;
    break;
  case TypeIds_Uint8ClampedArray:
    pRVar5 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).Uint8ClampedArrayConstructor.ptr;
    break;
  case TypeIds_Int16Array:
    pRVar5 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).Int16ArrayConstructor.ptr;
    break;
  case TypeIds_Uint16Array:
    pRVar5 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).Uint16ArrayConstructor.ptr;
    break;
  case TypeIds_Int32Array:
    pRVar5 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).Int32ArrayConstructor.ptr;
    break;
  case TypeIds_Uint32Array:
    pRVar5 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).Uint32ArrayConstructor.ptr;
    break;
  case TypeIds_Float32Array:
    pRVar5 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).Float32ArrayConstructor.ptr;
    break;
  case TypeIds_Float64Array:
    pRVar5 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).Float64ArrayConstructor.ptr;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x9b5,"((0))","UNREACHED");
    if (!bVar2) {
LAB_00d6c0f8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    pRVar5 = (RuntimeFunction *)0x0;
  }
  return &pRVar5->super_JavascriptFunction;
}

Assistant:

JavascriptFunction* TypedArrayBase::GetDefaultConstructor(Var object, ScriptContext* scriptContext)
    {
        switch (JavascriptOperators::GetTypeId(object))
        {
        case TypeId::TypeIds_Int8Array:
            return scriptContext->GetLibrary()->GetInt8ArrayConstructor();
        case TypeId::TypeIds_Uint8Array:
            return scriptContext->GetLibrary()->GetUint8ArrayConstructor();
        case TypeId::TypeIds_Uint8ClampedArray:
            return scriptContext->GetLibrary()->GetUint8ClampedArrayConstructor();
        case TypeId::TypeIds_Int16Array:
            return scriptContext->GetLibrary()->GetInt16ArrayConstructor();
        case TypeId::TypeIds_Uint16Array:
            return scriptContext->GetLibrary()->GetUint16ArrayConstructor();
        case TypeId::TypeIds_Int32Array:
            return scriptContext->GetLibrary()->GetInt32ArrayConstructor();
        case TypeId::TypeIds_Uint32Array:
            return scriptContext->GetLibrary()->GetUint32ArrayConstructor();
        case TypeId::TypeIds_Float32Array:
            return scriptContext->GetLibrary()->GetFloat32ArrayConstructor();
        case TypeId::TypeIds_Float64Array:
            return scriptContext->GetLibrary()->GetFloat64ArrayConstructor();
        default:
            Assert(UNREACHED);
            return nullptr;
        }
    }